

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cc
# Opt level: O0

void __thiscall
sentencepiece::util::Status::Status(Status *this,StatusCode code,string_view error_message)

{
  StatusCode SVar1;
  Rep *this_00;
  pointer pRVar2;
  allocator<char> local_49;
  string local_48 [36];
  StatusCode local_24;
  Status *pSStack_20;
  StatusCode code_local;
  Status *this_local;
  string_view error_message_local;
  
  error_message_local._M_len = (size_t)error_message._M_str;
  this_local = (Status *)error_message._M_len;
  local_24 = code;
  pSStack_20 = this;
  this_00 = (Rep *)operator_new(0x28);
  Rep::Rep(this_00);
  std::
  unique_ptr<sentencepiece::util::Status::Rep,std::default_delete<sentencepiece::util::Status::Rep>>
  ::unique_ptr<std::default_delete<sentencepiece::util::Status::Rep>,void>
            ((unique_ptr<sentencepiece::util::Status::Rep,std::default_delete<sentencepiece::util::Status::Rep>>
              *)this,this_00);
  SVar1 = local_24;
  pRVar2 = std::
           unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
           ::operator->(&this->rep_);
  pRVar2->code = SVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_49);
  pRVar2 = std::
           unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
           ::operator->(&this->rep_);
  std::__cxx11::string::operator=((string *)&pRVar2->error_message,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

Status::Status(StatusCode code, absl::string_view error_message)
    : rep_(new Rep) {
  rep_->code = code;
  rep_->error_message = std::string(error_message);
}